

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parse.cpp
# Opt level: O1

HTTP_CODE csguide_webserver::HttpRequestParser::ParseRequestline
                    (char *line,PARSE_STATE *parse_state,HttpRequest *request)

{
  int iVar1;
  HTTP_METHOD HVar2;
  HTTP_VERSION HVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar4 = strpbrk(line," \t");
  if (pcVar4 != (char *)0x0) {
    *pcVar4 = '\0';
    iVar1 = strcasecmp(line,"GET");
    if (iVar1 == 0) {
      HVar2 = GET;
    }
    else {
      iVar1 = strcasecmp(line,"POST");
      if (iVar1 == 0) {
        HVar2 = POST;
      }
      else {
        iVar1 = strcasecmp(line,"PUT");
        HVar2 = PUT;
        if (iVar1 != 0) {
          return BAD_REQUEST;
        }
      }
    }
    request->mMethod = HVar2;
    sVar5 = strspn(pcVar4 + 1," \t");
    __s = pcVar4 + 1 + sVar5;
    pcVar4 = strpbrk(__s," \t");
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      sVar5 = strspn(pcVar4 + 1," \t");
      iVar1 = strncasecmp("HTTP/1.1",pcVar4 + sVar5 + 1,8);
      if (iVar1 == 0) {
        HVar3 = HTTP_11;
      }
      else {
        iVar1 = strncasecmp("HTTP/1.0",pcVar4 + sVar5 + 1,8);
        if (iVar1 != 0) {
          return BAD_REQUEST;
        }
        HVar3 = HTTP_10;
      }
      request->mVersion = HVar3;
      iVar1 = strncasecmp(__s,"http://",7);
      if (iVar1 == 0) {
        __s = strchr(__s + 7,0x2f);
      }
      else {
        iVar1 = strncasecmp(__s,"/",1);
        if (iVar1 != 0) {
          return BAD_REQUEST;
        }
      }
      if (__s != (char *)0x0) {
        if (*__s == '/') {
          local_48[0] = local_38;
          sVar5 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,__s + sVar5);
          std::__cxx11::string::operator=((string *)&request->mUri,(string *)local_48);
          if (local_48[0] != local_38) {
            operator_delete(local_48[0]);
          }
          *parse_state = PARSE_HEADER;
          return NO_REQUEST;
        }
        return BAD_REQUEST;
      }
    }
  }
  return BAD_REQUEST;
}

Assistant:

HttpRequestParser::HTTP_CODE HttpRequestParser::ParseRequestline(char *line, PARSE_STATE &parse_state,
                                                                 HttpRequest &request) {
  char *url = strpbrk(line, " \t");
  if (!url) {
    return BAD_REQUEST;
  }

  // 分割 method 和 url
  *url++ = '\0';

  char *method = line;

  if (strcasecmp(method, "GET") == 0) {
    request.mMethod = HttpRequest::GET;
  } else if (strcasecmp(method, "POST") == 0) {
    request.mMethod = HttpRequest::POST;
  } else if (strcasecmp(method, "PUT") == 0) {
    request.mMethod = HttpRequest::PUT;
  } else {
    return BAD_REQUEST;
  }

  url += strspn(url, " \t");
  char *version = strpbrk(url, " \t");
  if (!version) {
    return BAD_REQUEST;
  }
  *version++ = '\0';
  version += strspn(version, " \t");

  // HTTP/1.1 后面可能还存在空白字符
  if (strncasecmp("HTTP/1.1", version, 8) == 0) {
    request.mVersion = HttpRequest::HTTP_11;
  } else if (strncasecmp("HTTP/1.0", version, 8) == 0) {
    request.mVersion = HttpRequest::HTTP_10;
  } else {
    return BAD_REQUEST;
  }

  if (strncasecmp(url, "http://", 7) == 0) {
    url += 7;
    url = strchr(url, '/');
  } else if (strncasecmp(url, "/", 1) == 0) {
    PASS;
  } else {
    return BAD_REQUEST;
  }

  if (!url || *url != '/') {
    return BAD_REQUEST;
  }
  request.mUri = std::string(url);
  // 分析头部字段
  parse_state = PARSE_HEADER;
  return NO_REQUEST;
}